

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

SimpleString __thiscall JUnitTestOutput::createFileName(JUnitTestOutput *this,SimpleString *group)

{
  bool bVar1;
  size_t extraout_RDX;
  long *in_RSI;
  SimpleString *in_RDI;
  SimpleString SVar2;
  SimpleString fileName;
  SimpleString *this_00;
  char *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  SimpleString *in_stack_ffffffffffffffb8;
  undefined1 local_28 [40];
  
  this_00 = in_RDI;
  SimpleString::SimpleString(in_RDI,(char *)in_RDI);
  bVar1 = SimpleString::isEmpty((SimpleString *)0x17bc6c);
  if (!bVar1) {
    SimpleString::operator+=(this_00,in_RDI);
    SimpleString::operator+=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  SimpleString::operator+=(this_00,in_RDI);
  (**(code **)(*in_RSI + 0x108))(&stack0xffffffffffffffb8,in_RSI,local_28);
  SimpleString::SimpleString(this_00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SimpleString::~SimpleString((SimpleString *)0x17bd1d);
  SimpleString::~SimpleString((SimpleString *)0x17bd27);
  SimpleString::~SimpleString((SimpleString *)0x17bd31);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)this_00;
  return SVar2;
}

Assistant:

SimpleString JUnitTestOutput::createFileName(const SimpleString& group)
{
    SimpleString fileName = "cpputest_";
    if (!impl_->package_.isEmpty()) {
        fileName += impl_->package_;
        fileName += "_";
    }
    fileName += group;
    return encodeFileName(fileName) + ".xml";
}